

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ConsumerIPCService::RemoteConsumer::OnTraceStats
          (RemoteConsumer *this,bool success,TraceStats *stats)

{
  undefined8 uVar1;
  GetTraceStatsResponse *this_00;
  TraceStats *this_01;
  AsyncResult<perfetto::protos::gen::GetTraceStatsResponse> local_50 [2];
  undefined1 local_30 [8];
  AsyncResult<perfetto::protos::gen::GetTraceStatsResponse> response;
  TraceStats *stats_local;
  bool success_local;
  RemoteConsumer *this_local;
  
  response._8_8_ = stats;
  if (success) {
    ipc::AsyncResult<perfetto::protos::gen::GetTraceStatsResponse>::Create();
    uVar1 = response._8_8_;
    this_00 = ipc::AsyncResult<perfetto::protos::gen::GetTraceStatsResponse>::operator->
                        ((AsyncResult<perfetto::protos::gen::GetTraceStatsResponse> *)local_30);
    this_01 = protos::gen::GetTraceStatsResponse::mutable_trace_stats(this_00);
    protos::gen::TraceStats::operator=(this_01,(TraceStats *)uVar1);
    ipc::AsyncResult<perfetto::protos::gen::GetTraceStatsResponse>::AsyncResult
              (local_50,(AsyncResult<perfetto::protos::gen::GetTraceStatsResponse> *)local_30);
    ipc::Deferred<perfetto::protos::gen::GetTraceStatsResponse>::Resolve
              (&this->get_trace_stats_response,local_50);
    ipc::AsyncResult<perfetto::protos::gen::GetTraceStatsResponse>::~AsyncResult(local_50);
    ipc::AsyncResult<perfetto::protos::gen::GetTraceStatsResponse>::~AsyncResult
              ((AsyncResult<perfetto::protos::gen::GetTraceStatsResponse> *)local_30);
  }
  else {
    ipc::DeferredBase::Reject(&(this->get_trace_stats_response).super_DeferredBase);
  }
  return;
}

Assistant:

void ConsumerIPCService::RemoteConsumer::OnTraceStats(bool success,
                                                      const TraceStats& stats) {
  if (!success) {
    std::move(get_trace_stats_response).Reject();
    return;
  }
  auto response =
      ipc::AsyncResult<protos::gen::GetTraceStatsResponse>::Create();
  *response->mutable_trace_stats() = stats;
  std::move(get_trace_stats_response).Resolve(std::move(response));
}